

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_container.h
# Opt level: O2

pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_*>,_bool>
* __thiscall
absl::lts_20240722::container_internal::
btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::EnumDescriptor_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumDescriptor_const*>>,256,false>>>
::emplace<std::__cxx11::string,google::protobuf::EnumDescriptor_const*&>
          (pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_*>,_bool>
           *__return_storage_ptr__,void *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          EnumDescriptor **args_1)

{
  slot_type *slot;
  node_handle<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>,_absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_void>
  node;
  slot_type *local_58;
  node_handle_base<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>_>
  local_50;
  
  node_handle_base<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::EnumDescriptor_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumDescriptor_const*>>,256,false>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumDescriptor_const*>>>
  ::node_handle_base<std::__cxx11::string,google::protobuf::EnumDescriptor_const*&>
            ((node_handle_base<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::EnumDescriptor_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumDescriptor_const*>>,256,false>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumDescriptor_const*>>>
              *)&local_50,&local_58);
  local_58 = node_handle_base<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>_>
             ::slot(&local_50);
  btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::EnumDescriptor_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumDescriptor_const*>>,256,false>>
  ::
  insert_unique<std::__cxx11::string,absl::lts_20240722::container_internal::map_slot_type<std::__cxx11::string,google::protobuf::EnumDescriptor_const*>*&>
            (__return_storage_ptr__,
             (btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::EnumDescriptor_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumDescriptor_const*>>,256,false>>
              *)this,&(local_58->value).first,&local_58);
  node_handle_base<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>_>
  ::~node_handle_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace(Args &&...args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    // Use a node handle to manage a temp slot.
    auto node = CommonAccess::Construct<node_type>(this->get_allocator(),
                                                   std::forward<Args>(args)...);
    auto *slot = CommonAccess::GetSlot(node);
    return this->tree_.insert_unique(params_type::key(slot), slot);
  }